

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::add(Matrix *this,Matrix *input)

{
  size_t sVar1;
  size_t sVar2;
  double *pdVar3;
  long lVar4;
  
  sVar1 = input->rows;
  if ((sVar1 == this->rows) && (sVar2 = input->cols, sVar2 == this->cols)) {
    pdVar3 = this->data;
    for (lVar4 = 0; sVar2 * sVar1 - lVar4 != 0; lVar4 = lVar4 + 1) {
      pdVar3[lVar4] = input->data[lVar4] + pdVar3[lVar4];
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"Rows and Cols don\'t match up");
    this = (Matrix *)0x0;
  }
  return this;
}

Assistant:

Matrix* Matrix::add(Matrix* input) {
	if (input->rows != rows || input->cols != cols) {
		std::cout << "Rows and Cols don't match up";
		return nullptr;
	}

	for (size_t i = 0; i < rows*cols; i++) {
		data[i] += input->data[i];
	}
	return this;
}